

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayColorDepthAttachments.cpp
# Opt level: O3

IterateResult __thiscall
glcts::TextureCubeMapArrayColorDepthAttachmentsTest::iterate
          (TextureCubeMapArrayColorDepthAttachmentsTest *this)

{
  _texture_size *p_Var1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  char *description;
  _texture_size *texture_size;
  bool bVar5;
  long lVar4;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  initTest(this);
  (**(code **)(lVar4 + 0x1c0))(0,0,0,0);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glClearColor() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayColorDepthAttachments.cpp"
                  ,0x283);
  (**(code **)(lVar4 + 0x1d0))(0x3f800000);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glClearDepthf() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayColorDepthAttachments.cpp"
                  ,0x286);
  (**(code **)(lVar4 + 0x5e0))(0xb71);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glEnable() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayColorDepthAttachments.cpp"
                  ,0x28a);
  p_Var1 = (this->m_resolutions).
           super__Vector_base<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size,_std::allocator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (texture_size = (this->m_resolutions).
                      super__Vector_base<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size,_std::allocator<glcts::TextureCubeMapArrayColorDepthAttachmentsTest::_texture_size>_>
                      ._M_impl.super__Vector_impl_data._M_start; p_Var1 != texture_size;
      texture_size = texture_size + 1) {
    testNonLayeredRendering(this,texture_size,false);
    testNonLayeredRendering(this,texture_size,true);
    testLayeredRendering(this,texture_size,false);
    testLayeredRendering(this,texture_size,true);
  }
  bVar5 = this->m_n_invalid_depth_checks != 0 || this->m_n_invalid_color_checks != 0;
  if (bVar5) {
    description = "Fail";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,(uint)bVar5,
             description);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult TextureCubeMapArrayColorDepthAttachmentsTest::iterate()
{
	/* GL functions */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initialize all ES objects needed to run the test */
	initTest();

	/* Setup clear values */
	gl.clearColor(0.0f /* red */, 0.0f /* green */, 0.0f /* blue */, 0.0f /* alpha */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearColor() call failed.");

	gl.clearDepthf(1.0f /* d */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearDepthf() call failed.");

	/* Enable depth test */
	gl.enable(GL_DEPTH_TEST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable() call failed");

	/* Execute tests for each resolution */
	for (_texture_size_vector::iterator texture_size_iterator = m_resolutions.begin(),
										end_iterator		  = m_resolutions.end();
		 end_iterator != texture_size_iterator; ++texture_size_iterator)
	{
		testNonLayeredRendering(*texture_size_iterator, false);
		testNonLayeredRendering(*texture_size_iterator, true);
		testLayeredRendering(*texture_size_iterator, false);
		testLayeredRendering(*texture_size_iterator, true);
	}

	/* Test passes if there were no errors */
	if ((0 != m_n_invalid_color_checks) || (0 != m_n_invalid_depth_checks))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}

	/* Done */
	return STOP;
}